

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutualInformation.cpp
# Opt level: O0

void __thiscall MutualInformation::~MutualInformation(MutualInformation *this)

{
  MutualInformation *in_RDI;
  
  ~MutualInformation(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

MutualInformation::~MutualInformation()
{
}